

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractprintdialog.cpp
# Opt level: O0

void __thiscall QAbstractPrintDialog::setFromTo(QAbstractPrintDialog *this,int from,int to)

{
  QAbstractPrintDialogPrivate *pQVar1;
  QPrinter *in_RDI;
  QAbstractPrintDialogPrivate *d;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  pQVar1 = d_func((QAbstractPrintDialog *)0x15f844);
  QPrinter::setFromTo(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  if ((pQVar1->minPage == 0) && (pQVar1->maxPage == 0)) {
    setMinMax((QAbstractPrintDialog *)in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QAbstractPrintDialog::setFromTo(int from, int to)
{
    Q_D(QAbstractPrintDialog);
    Q_ASSERT_X(from <= to, "QAbstractPrintDialog::setFromTo",
               "'from' must be less than or equal to 'to'");
    d->printer->setFromTo(from, to);

    if (d->minPage == 0 && d->maxPage == 0)
        setMinMax(1, to);
}